

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAML.h
# Opt level: O2

double jaegertracing::utils::yaml::findOrDefault<double,char[6],int>
                 (Node *node,char (*key) [6],int *defaultValue)

{
  double dVar1;
  Node valueNode;
  Node local_30;
  
  YAML::Node::operator[]<char[6]>(&local_30,node,key);
  if ((local_30.m_isValid == true) &&
     ((local_30.m_pNode == (node *)0x0 || (*(char *)**(undefined8 **)local_30.m_pNode != '\0')))) {
    dVar1 = YAML::Node::as<double>(&local_30);
  }
  else {
    dVar1 = (double)*defaultValue;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.m_pMemory.
              super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return dVar1;
}

Assistant:

ValueType findOrDefault(const YAML::Node& node,
                        const KeyType& key,
                        const DefaultValueType& defaultValue)
{
    const auto valueNode = node[key];
    if (!valueNode.IsDefined()) {
        return defaultValue;
    }
    return valueNode.template as<ValueType>();
}